

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_tls.c
# Opt level: O2

int mbedtls_ssl_send_alert_message(mbedtls_ssl_context *ssl,uchar level,uchar message)

{
  int ret;
  int iVar1;
  
  iVar1 = -0x7100;
  if ((ssl != (mbedtls_ssl_context *)0x0) && (ssl->conf != (mbedtls_ssl_config *)0x0)) {
    iVar1 = 0;
    mbedtls_debug_print_msg
              (ssl,2,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_tls.c"
               ,0xf5f,"=> send alert message");
    ssl->out_msgtype = 0x15;
    ssl->out_msglen = 2;
    *ssl->out_msg = level;
    ssl->out_msg[1] = message;
    ret = mbedtls_ssl_write_record(ssl);
    if (ret == 0) {
      mbedtls_debug_print_msg
                (ssl,2,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_tls.c"
                 ,0xf6c,"<= send alert message");
    }
    else {
      mbedtls_debug_print_ret
                (ssl,1,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_tls.c"
                 ,0xf68,"mbedtls_ssl_write_record",ret);
      iVar1 = ret;
    }
  }
  return iVar1;
}

Assistant:

int mbedtls_ssl_send_alert_message( mbedtls_ssl_context *ssl,
                            unsigned char level,
                            unsigned char message )
{
    int ret;

    if( ssl == NULL || ssl->conf == NULL )
        return( MBEDTLS_ERR_SSL_BAD_INPUT_DATA );

    MBEDTLS_SSL_DEBUG_MSG( 2, ( "=> send alert message" ) );

    ssl->out_msgtype = MBEDTLS_SSL_MSG_ALERT;
    ssl->out_msglen = 2;
    ssl->out_msg[0] = level;
    ssl->out_msg[1] = message;

    if( ( ret = mbedtls_ssl_write_record( ssl ) ) != 0 )
    {
        MBEDTLS_SSL_DEBUG_RET( 1, "mbedtls_ssl_write_record", ret );
        return( ret );
    }

    MBEDTLS_SSL_DEBUG_MSG( 2, ( "<= send alert message" ) );

    return( 0 );
}